

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_calc_max_elem(int comptype,int nx,int zbitpix,int blocksize)

{
  int blocksize_local;
  int zbitpix_local;
  int nx_local;
  int comptype_local;
  undefined4 local_4;
  
  if (comptype == 0xb) {
    if (zbitpix == 0x10) {
      local_4 = nx * 2 + nx / blocksize + 6;
    }
    else {
      local_4 = nx * 4 + nx / blocksize + 6;
    }
  }
  else if ((comptype == 0x15) || (comptype == 0x16)) {
    if (zbitpix == 0x10) {
      local_4 = nx << 1;
    }
    else {
      local_4 = nx;
      if (zbitpix != 8) {
        local_4 = nx << 2;
      }
    }
  }
  else if (comptype == 0x33) {
    local_4 = (int)(((double)nx * 1.01 * (double)zbitpix) / 8.0 + 601.0);
  }
  else if (comptype == 0x29) {
    if ((zbitpix == 0x10) || (zbitpix == 8)) {
      local_4 = (int)((double)nx * 2.2 + 26.0);
    }
    else {
      local_4 = (int)((double)nx * 4.4 + 26.0);
    }
  }
  else {
    local_4 = nx << 2;
  }
  return local_4;
}

Assistant:

int imcomp_calc_max_elem (int comptype, int nx, int zbitpix, int blocksize)

/* This function returns the maximum number of bytes in a compressed
   image line.

    nx = maximum number of pixels in a tile
    blocksize is only relevant for RICE compression
*/
{    
    if (comptype == RICE_1)
    {
        if (zbitpix == 16)
            return (sizeof(short) * nx + nx / blocksize + 2 + 4);
	else
            return (sizeof(float) * nx + nx / blocksize + 2 + 4);
    }
    else if ((comptype == GZIP_1) || (comptype == GZIP_2))
    {
        /* gzip usually compressed by at least a factor of 2 for I*4 images */
        /* and somewhat less for I*2 images */
        /* If this size turns out to be too small, then the gzip */
        /* compression routine will allocate more space as required */
        /* to be on the safe size, allocate buffer same size as input */
	
        if (zbitpix == 16)
            return(nx * 2);
	else if (zbitpix == 8)
            return(nx);
	else
            return(nx * 4);
    }
    else if (comptype == BZIP2_1)
    {
        /* To guarantee that the compressed data will fit, allocate an output
	   buffer of size 1% larger than the uncompressed data, plus 600 bytes */

            return((int) (nx * 1.01 * zbitpix / 8. + 601.));
    }
     else if (comptype == HCOMPRESS_1)
    {
        /* Imperical evidence suggests in the worst case, 
	   the compressed stream could be up to 10% larger than the original
	   image.  Add 26 byte overhead, only significant for very small tiles
	   
         Possible improvement: may need to allow a larger size for 32-bit images */

        if (zbitpix == 16 || zbitpix == 8)
	
            return( (int) (nx * 2.2 + 26));   /* will be compressing 16-bit int array */
        else
            return( (int) (nx * 4.4 + 26));   /* will be compressing 32-bit int array */
    }
    else
        return(nx * sizeof(int));
}